

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcDar.c
# Opt level: O1

int Abc_NtkDarSec(Abc_Ntk_t *pNtk1,Abc_Ntk_t *pNtk2,Fra_Sec_t *pSecPar)

{
  int iVar1;
  Abc_Ntk_t *pMiter;
  int *__ptr;
  Aig_Man_t *p;
  char *format;
  Abc_Ntk_t *pAVar2;
  
  pMiter = Abc_NtkMiter(pNtk1,pNtk2,0,0,0,0);
  iVar1 = (int)pNtk1;
  if (pMiter == (Abc_Ntk_t *)0x0) {
    format = "Miter computation has failed.\n";
  }
  else {
    pAVar2 = pMiter;
    iVar1 = Abc_NtkMiterIsConstant(pMiter);
    if (iVar1 == 1) {
      Abc_NtkDelete(pMiter);
      Abc_Print((int)pMiter,"Networks are equivalent after structural hashing.\n");
      return 1;
    }
    if (iVar1 == 0) {
      Abc_Print((int)pAVar2,"Networks are NOT EQUIVALENT after structural hashing.\n");
      __ptr = Abc_NtkVerifyGetCleanModel(pMiter,pSecPar->nFramesMax);
      pMiter->pModel = __ptr;
      if (__ptr != (int *)0x0) {
        free(__ptr);
        pMiter->pModel = (int *)0x0;
      }
      Abc_NtkDelete(pMiter);
      return 0;
    }
    p = Abc_NtkToDar(pMiter,0,1);
    Abc_NtkDelete(pMiter);
    iVar1 = (int)pMiter;
    if (p != (Aig_Man_t *)0x0) {
      if (0 < p->nRegs) {
        iVar1 = Fra_FraigSec(p,pSecPar,(Aig_Man_t **)0x0);
        Aig_ManStop(p);
        return iVar1;
      }
      __assert_fail("pMan->nRegs > 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcDar.c"
                    ,0xbc7,"int Abc_NtkDarSec(Abc_Ntk_t *, Abc_Ntk_t *, Fra_Sec_t *)");
    }
    format = "Converting miter into AIG has failed.\n";
  }
  Abc_Print(iVar1,format);
  return -1;
}

Assistant:

int Abc_NtkDarSec( Abc_Ntk_t * pNtk1, Abc_Ntk_t * pNtk2, Fra_Sec_t * pSecPar )
{
//    Fraig_Params_t Params;
    Aig_Man_t * pMan;
    Abc_Ntk_t * pMiter;//, * pTemp;
    int RetValue;
 
    // get the miter of the two networks
    pMiter = Abc_NtkMiter( pNtk1, pNtk2, 0, 0, 0, 0 );
    if ( pMiter == NULL )
    {
        Abc_Print( 1, "Miter computation has failed.\n" );
        return -1;
    }
    RetValue = Abc_NtkMiterIsConstant( pMiter );
    if ( RetValue == 0 )
    {
        extern void Abc_NtkVerifyReportErrorSeq( Abc_Ntk_t * pNtk1, Abc_Ntk_t * pNtk2, int * pModel, int nFrames );
        Abc_Print( 1, "Networks are NOT EQUIVALENT after structural hashing.\n" );
        // report the error
        pMiter->pModel = Abc_NtkVerifyGetCleanModel( pMiter, pSecPar->nFramesMax );
//        Abc_NtkVerifyReportErrorSeq( pNtk1, pNtk2, pMiter->pModel, pSecPar->nFramesMax );
        ABC_FREE( pMiter->pModel );
        Abc_NtkDelete( pMiter );
        return 0;
    }
    if ( RetValue == 1 )
    {
        Abc_NtkDelete( pMiter );
        Abc_Print( 1, "Networks are equivalent after structural hashing.\n" );
        return 1;
    }

    // commented out because sometimes the problem became non-inductive
/*
    // preprocess the miter by fraiging it
    // (note that for each functional class, fraiging leaves one representative;
    // so fraiging does not reduce the number of functions represented by nodes
    Fraig_ParamsSetDefault( &Params );
    Params.nBTLimit = 100000;
    pMiter = Abc_NtkFraig( pTemp = pMiter, &Params, 0, 0 );
    Abc_NtkDelete( pTemp );
    RetValue = Abc_NtkMiterIsConstant( pMiter );
    if ( RetValue == 0 )
    {
        extern void Abc_NtkVerifyReportErrorSeq( Abc_Ntk_t * pNtk1, Abc_Ntk_t * pNtk2, int * pModel, int nFrames );
        Abc_Print( 1, "Networks are NOT EQUIVALENT after structural hashing.\n" );
        // report the error
        pMiter->pModel = Abc_NtkVerifyGetCleanModel( pMiter, nFrames );
        Abc_NtkVerifyReportErrorSeq( pNtk1, pNtk2, pMiter->pModel, nFrames );
        ABC_FREE( pMiter->pModel );
        Abc_NtkDelete( pMiter );
        return 0;
    }
    if ( RetValue == 1 )
    {
        Abc_NtkDelete( pMiter );
        Abc_Print( 1, "Networks are equivalent after structural hashing.\n" );
        return 1;
    }
*/
    // derive the AIG manager
    pMan = Abc_NtkToDar( pMiter, 0, 1 );
    Abc_NtkDelete( pMiter );
    if ( pMan == NULL )
    {
        Abc_Print( 1, "Converting miter into AIG has failed.\n" );
        return -1;
    }
    assert( pMan->nRegs > 0 );

    // perform verification
    RetValue = Fra_FraigSec( pMan, pSecPar, NULL );
    Aig_ManStop( pMan );
    return RetValue;
}